

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

MatchType __thiscall TileData::tryMatching(TileData *this,TileData *other)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  auVar8[0] = -((other->_data)._M_elems[0] == (this->_data)._M_elems[0]);
  auVar8[1] = -((other->_data)._M_elems[1] == (this->_data)._M_elems[1]);
  auVar8[2] = -((other->_data)._M_elems[2] == (this->_data)._M_elems[2]);
  auVar8[3] = -((other->_data)._M_elems[3] == (this->_data)._M_elems[3]);
  auVar8[4] = -((other->_data)._M_elems[4] == (this->_data)._M_elems[4]);
  auVar8[5] = -((other->_data)._M_elems[5] == (this->_data)._M_elems[5]);
  auVar8[6] = -((other->_data)._M_elems[6] == (this->_data)._M_elems[6]);
  auVar8[7] = -((other->_data)._M_elems[7] == (this->_data)._M_elems[7]);
  auVar8[8] = -((other->_data)._M_elems[8] == (this->_data)._M_elems[8]);
  auVar8[9] = -((other->_data)._M_elems[9] == (this->_data)._M_elems[9]);
  auVar8[10] = -((other->_data)._M_elems[10] == (this->_data)._M_elems[10]);
  auVar8[0xb] = -((other->_data)._M_elems[0xb] == (this->_data)._M_elems[0xb]);
  auVar8[0xc] = -((other->_data)._M_elems[0xc] == (this->_data)._M_elems[0xc]);
  auVar8[0xd] = -((other->_data)._M_elems[0xd] == (this->_data)._M_elems[0xd]);
  auVar8[0xe] = -((other->_data)._M_elems[0xe] == (this->_data)._M_elems[0xe]);
  auVar8[0xf] = -((other->_data)._M_elems[0xf] == (this->_data)._M_elems[0xf]);
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf) ==
      0xffff) {
    return EXACT;
  }
  if (options.allowMirroring) {
    lVar5 = 0;
    while (flipTable._M_elems[(other->_data)._M_elems[lVar5]] == (this->_data)._M_elems[lVar5]) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x10) {
        return HFLIP;
      }
    }
    bVar4 = true;
    uVar6 = 0xf;
    bVar3 = true;
    while( true ) {
      bVar1 = (this->_data)._M_elems[0];
      bVar2 = (other->_data)._M_elems[uVar6 ^ 1];
      if (bVar1 != bVar2) {
        bVar4 = false;
      }
      if (bVar1 != flipTable._M_elems[bVar2]) {
        bVar3 = false;
      }
      if ((!bVar4) && (!bVar3)) break;
      this = (TileData *)((this->_data)._M_elems + 1);
      bVar7 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar7) {
        if ((bVar4 == false) && (!bVar3)) {
          __assert_fail("hasVFlip || hasVHFlip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x2f6,"tryMatching");
        }
        return VHFLIP - bVar4;
      }
    }
  }
  return NOPE;
}

Assistant:

MatchType tryMatching(TileData const &other) const {
		// Check for strict equality first, as that can typically be optimized, and it allows
		// hoisting the mirroring check out of the loop
		if (_data == other._data) {
			return MatchType::EXACT;
		}

		if (!options.allowMirroring) {
			return MatchType::NOPE;
		}

		// Check if we have horizontal mirroring, which scans the array forward again
		if (std::equal(_data.begin(), _data.end(), other._data.begin(),
		               [](uint8_t lhs, uint8_t rhs) { return lhs == flipTable[rhs]; })) {
			return MatchType::HFLIP;
		}

		// Check if we have vertical or vertical+horizontal mirroring, for which we have to read
		// bitplane *pairs*  backwards
		bool hasVFlip = true, hasVHFlip = true;
		for (uint8_t i = 0; i < _data.size(); ++i) {
			// Flip the bottom bit to get the corresponding row's bitplane 0/1
			// (This works because the array size is even)
			uint8_t lhs = _data[i], rhs = other._data[(15 - i) ^ 1];
			if (lhs != rhs) {
				hasVFlip = false;
			}
			if (lhs != flipTable[rhs]) {
				hasVHFlip = false;
			}
			if (!hasVFlip && !hasVHFlip) {
				return MatchType::NOPE; // If both have been eliminated, all hope is lost!
			}
		}

		// If we have both (i.e. we have symmetry), default to vflip only
		assert(hasVFlip || hasVHFlip);
		return hasVFlip ? MatchType::VFLIP : MatchType::VHFLIP;
	}